

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O3

void test_to_number<int>(char *str,int wanted,bool error,_func_int_char_ptr *fn)

{
  int iVar1;
  size_t sVar2;
  long *plVar3;
  string msg;
  
  iVar1 = (*fn)(str);
  if (iVar1 == wanted) {
    if (str == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x2fd2a8);
    }
    else {
      sVar2 = strlen(str);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,str,sVar2);
    }
    plVar3 = &std::cout;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," to int: PASSED",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  }
  else {
    if (str == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x2fd2a8);
    }
    else {
      sVar2 = strlen(str);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,str,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," to int failed; got ",0x14);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  }
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return;
}

Assistant:

void
test_to_number(char const* str, int_T wanted, bool error, int_T (*fn)(char const*))
{
    bool threw = false;
    bool worked = false;
    int_T result = 0;
    std::string msg;
    try {
        result = fn(str);
        worked = (wanted == result);
    } catch (std::runtime_error const& e) {
        threw = true;
        msg = e.what();
    }
    if (threw) {
        if (error) {
            std::cout << str << " to int threw (" << msg << "): PASSED" << std::endl;
        } else {
            std::cout << str << " to int threw but wanted " << wanted << std::endl;
        }
    } else {
        if (worked) {
            std::cout << str << " to int: PASSED" << std::endl;
        } else {
            std::cout << str << " to int failed; got " << result << std::endl;
        }
    }
}